

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

void __thiscall MathInterpreter::insertVariables(MathInterpreter *this,string *variable)

{
  bool bVar1;
  char *pcVar2;
  Expression *pEVar3;
  mapped_type *ppVVar4;
  undefined8 *puVar5;
  double extraout_XMM0_Qa;
  _Self local_b0;
  _Self local_a8;
  double local_a0;
  double value;
  string local_88 [32];
  string local_68;
  Expression *local_48;
  Expression *e;
  string name;
  int p;
  string *variable_local;
  MathInterpreter *this_local;
  
  name.field_2._12_4_ = std::__cxx11::string::find((char *)variable,0x120aa4);
  std::__cxx11::string::substr((ulong)&e,(ulong)variable);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_88,(ulong)variable);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,pcVar2,(allocator *)((long)&value + 3));
  pEVar3 = interpret(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&value + 3));
  std::__cxx11::string::~string(local_88);
  local_48 = pEVar3;
  (**pEVar3->_vptr_Expression)();
  local_a0 = extraout_XMM0_Qa;
  if (local_48 != (Expression *)0x0) {
    (*local_48->_vptr_Expression[2])();
  }
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
       ::find(this->variables,(key_type *)&e);
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
       ::end(this->variables);
  bVar1 = std::operator!=(&local_a8,&local_b0);
  if (!bVar1) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "assign to unexist variable\n";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  ppVVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            ::at(this->variables,(key_type *)&e);
  Variable::setValue(*ppVVar4,local_a0);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

void MathInterpreter::insertVariables(string variable) {
  int p = variable.find("=");
  string name = variable.substr(0, p);
  Expression
      *e = this->interpret(variable.substr(p + 1, variable.length()).c_str());
  double value = e->calculate();
  delete e;
  if (this->variables->find(name) != this->variables->end()) {
    this->variables->at(name)->setValue(value);
  } else {
    throw ("assign to unexist variable\n");
  }
}